

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

void __thiscall maths::Matrix::~Matrix(Matrix *this)

{
  void *pvVar1;
  int *in_RDI;
  int i;
  int local_c;
  
  for (local_c = 0; local_c < *in_RDI; local_c = local_c + 1) {
    pvVar1 = *(void **)(*(long *)(in_RDI + 2) + (long)local_c * 8);
    if (pvVar1 != (void *)0x0) {
      operator_delete__(pvVar1);
    }
  }
  if (*(void **)(in_RDI + 2) != (void *)0x0) {
    operator_delete__(*(void **)(in_RDI + 2));
  }
  return;
}

Assistant:

Matrix::~Matrix()
{
    for (int i = 0; i < rows_; ++i) {
        delete[] p[i];
    }
    delete[] p;
}